

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O2

void __thiscall
DTSStreamReader::checkIfOnlyHDDataExists(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  int i;
  uint uVar5;
  BitStreamReader reader;
  
  uVar5 = 0;
  for (; (uVar5 < 2 && (buff < end + -4)); buff = (uint8_t *)((long)buff + (long)(int)uVar4 + 1)) {
    uVar1 = *(uint32_t *)buff;
    uVar3 = my_ntohl(0x64582025);
    if (uVar1 != uVar3) {
      return;
    }
    reader.super_BitStream.m_totalBits = 0;
    reader.super_BitStream.m_buffer = (uint *)0x0;
    reader.super_BitStream.m_initBuffer = (uint *)0x0;
    reader.m_curVal = 0;
    reader.m_bitLeft = 0;
    BitStreamReader::setBuffer(&reader,(uint8_t *)((long)buff + 5),end);
    BitStreamReader::skipBits(&reader,2);
    bVar2 = BitStreamReader::getBit(&reader);
    if (bVar2) {
      BitStreamReader::skipBits(&reader,0xc);
      uVar4 = BitStreamReader::getBits(&reader,0x14);
    }
    else {
      BitStreamReader::skipBits(&reader,8);
      uVar4 = BitStreamReader::getBits(&reader,0x10);
      uVar4 = uVar4 & 0xffff;
    }
    uVar5 = uVar5 + 1;
  }
  this->m_isCoreExists = false;
  return;
}

Assistant:

void DTSStreamReader::checkIfOnlyHDDataExists(uint8_t* buff, const uint8_t* end)
{
    for (int i = 0; i < 2 && buff < end - 4; ++i)
    {
        const bool isHDData = *reinterpret_cast<uint32_t*>(buff) == my_htonl(DTS_HD_PREFIX);
        if (!isHDData)
            return;

        BitStreamReader reader{};
        reader.setBuffer(buff + 5, end);  // skip 4 byte magic and 1 unknown byte
        int hdFrameSize;
        reader.skipBits(2);  // nuSubStreamIndex
        if (reader.getBit())
        {
            reader.skipBits(12);  // headerSize
            hdFrameSize = reader.getBits<int32_t>(20) + 1;
        }
        else
        {
            reader.skipBits(8);  // headerSize
            hdFrameSize = reader.getBits<uint16_t>(16) + 1;
        }
        buff += hdFrameSize;
    }
    m_isCoreExists = false;
}